

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbinode.cpp
# Opt level: O0

void __thiscall icu_63::RBBINode::RBBINode(RBBINode *this,RBBINode *other)

{
  UVector *pUVar1;
  UnicodeString *src;
  UVector *local_90;
  UVector *local_80;
  UVector *local_70;
  undefined1 local_28 [8];
  UErrorCode status;
  undefined8 local_18;
  RBBINode *other_local;
  RBBINode *this_local;
  
  local_18 = other;
  other_local = this;
  UnicodeString::UnicodeString(&this->fText);
  this->fType = *(NodeType *)local_18;
  this->fParent = (RBBINode *)0x0;
  this->fLeftChild = (RBBINode *)0x0;
  this->fRightChild = (RBBINode *)0x0;
  this->fInputSet = *(UnicodeSet **)(local_18 + 0x20);
  this->fPrecedence = *(OpPrecedence *)(local_18 + 0x28);
  src = (UnicodeString *)(local_18 + 0x30);
  UnicodeString::operator=(&this->fText,src);
  this->fFirstPos = *(int *)(local_18 + 0x70);
  this->fLastPos = *(int *)(local_18 + 0x74);
  this->fNullable = *(UBool *)(local_18 + 0x78);
  this->fVal = *(int32_t *)(local_18 + 0x7c);
  this->fRuleRoot = '\0';
  this->fChainIn = *(UBool *)(local_18 + 0x82);
  local_28._0_4_ = U_ZERO_ERROR;
  pUVar1 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)src);
  local_70 = (UVector *)0x0;
  if (pUVar1 != (UVector *)0x0) {
    src = (UnicodeString *)local_28;
    UVector::UVector(pUVar1,(UErrorCode *)src);
    local_70 = pUVar1;
  }
  this->fFirstPosSet = local_70;
  pUVar1 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)src);
  local_80 = (UVector *)0x0;
  if (pUVar1 != (UVector *)0x0) {
    src = (UnicodeString *)local_28;
    UVector::UVector(pUVar1,(UErrorCode *)src);
    local_80 = pUVar1;
  }
  this->fLastPosSet = local_80;
  pUVar1 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)src);
  local_90 = (UVector *)0x0;
  if (pUVar1 != (UVector *)0x0) {
    UVector::UVector(pUVar1,(UErrorCode *)local_28);
    local_90 = pUVar1;
  }
  this->fFollowPos = local_90;
  return;
}

Assistant:

RBBINode::RBBINode(const RBBINode &other) : UMemory(other) {
#ifdef RBBI_DEBUG
    fSerialNum   = ++gLastSerial;
#endif
    fType        = other.fType;
    fParent      = NULL;
    fLeftChild   = NULL;
    fRightChild  = NULL;
    fInputSet    = other.fInputSet;
    fPrecedence  = other.fPrecedence;
    fText        = other.fText;
    fFirstPos    = other.fFirstPos;
    fLastPos     = other.fLastPos;
    fNullable    = other.fNullable;
    fVal         = other.fVal;
    fRuleRoot    = FALSE;
    fChainIn     = other.fChainIn;
    UErrorCode     status = U_ZERO_ERROR;
    fFirstPosSet = new UVector(status);   // TODO - get a real status from somewhere
    fLastPosSet  = new UVector(status);
    fFollowPos   = new UVector(status);
}